

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_draw.cpp
# Opt level: O0

ImFont * __thiscall ImFontAtlas::AddFont(ImFontAtlas *this,ImFontConfig *font_cfg)

{
  bool bVar1;
  ImFont *this_00;
  value_type *pvVar2;
  value_type *ppIVar3;
  void *pvVar4;
  ImFontConfig *new_font_cfg;
  value_type local_20;
  ImFont *font;
  ImFontConfig *font_cfg_local;
  ImFontAtlas *this_local;
  
  bVar1 = false;
  if (font_cfg->FontData != (void *)0x0) {
    bVar1 = 0 < font_cfg->FontDataSize;
  }
  font = (ImFont *)font_cfg;
  font_cfg_local = (ImFontConfig *)this;
  if (!bVar1) {
    __assert_fail("font_cfg->FontData != __null && font_cfg->FontDataSize > 0",
                  "/workspace/llm4binary/github/license_c_cmakelists/gwerners[P]BasicGLFWImgui/imgui_draw.cpp"
                  ,0x46d,"ImFont *ImFontAtlas::AddFont(const ImFontConfig *)");
  }
  if (0.0 < font_cfg->SizePixels) {
    if ((font_cfg->MergeMode & 1U) == 0) {
      local_20 = (value_type)ImGui::MemAlloc(0x68);
      this_00 = (ImFont *)operator_new(0x68);
      ImFont::ImFont(this_00);
      ImVector<ImFont_*>::push_back(&this->Fonts,&local_20);
    }
    ImVector<ImFontConfig>::push_back(&this->ConfigData,(value_type *)font);
    pvVar2 = ImVector<ImFontConfig>::back(&this->ConfigData);
    if (pvVar2->DstFont == (ImFont *)0x0) {
      ppIVar3 = ImVector<ImFont_*>::back(&this->Fonts);
      pvVar2->DstFont = *ppIVar3;
    }
    if ((pvVar2->FontDataOwnedByAtlas & 1U) == 0) {
      pvVar4 = ImGui::MemAlloc((long)pvVar2->FontDataSize);
      pvVar2->FontData = pvVar4;
      pvVar2->FontDataOwnedByAtlas = true;
      memcpy(pvVar2->FontData,*(void **)font,(long)pvVar2->FontDataSize);
    }
    ClearTexData(this);
    return pvVar2->DstFont;
  }
  __assert_fail("font_cfg->SizePixels > 0.0f",
                "/workspace/llm4binary/github/license_c_cmakelists/gwerners[P]BasicGLFWImgui/imgui_draw.cpp"
                ,0x46e,"ImFont *ImFontAtlas::AddFont(const ImFontConfig *)");
}

Assistant:

ImFont* ImFontAtlas::AddFont(const ImFontConfig* font_cfg)
{
    IM_ASSERT(font_cfg->FontData != NULL && font_cfg->FontDataSize > 0);
    IM_ASSERT(font_cfg->SizePixels > 0.0f);

    // Create new font
    if (!font_cfg->MergeMode)
    {
        ImFont* font = (ImFont*)ImGui::MemAlloc(sizeof(ImFont));
        IM_PLACEMENT_NEW(font) ImFont();
        Fonts.push_back(font);
    }

    ConfigData.push_back(*font_cfg);
    ImFontConfig& new_font_cfg = ConfigData.back();
	if (!new_font_cfg.DstFont)
	    new_font_cfg.DstFont = Fonts.back();
    if (!new_font_cfg.FontDataOwnedByAtlas)
    {
        new_font_cfg.FontData = ImGui::MemAlloc(new_font_cfg.FontDataSize);
        new_font_cfg.FontDataOwnedByAtlas = true;
        memcpy(new_font_cfg.FontData, font_cfg->FontData, (size_t)new_font_cfg.FontDataSize);
    }

    // Invalidate texture
    ClearTexData();
    return new_font_cfg.DstFont;
}